

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O1

void test_hsort_is_sorted(uchar *elements,size_t n,size_t len)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  uchar *puVar5;
  size_t sVar6;
  int iVar7;
  size_t sVar8;
  uchar auStack_70 [40];
  ulong uStack_48;
  
  if (1 < n) {
    puVar5 = elements + len;
    sVar6 = 1;
    do {
      if (len != 0) {
        sVar8 = 0;
        do {
          bVar1 = *(byte *)((long)((secp256k1_fe *)elements)->n + sVar8);
          iVar7 = (uint)bVar1 - (uint)puVar5[sVar8];
          if (bVar1 != puVar5[sVar8]) goto LAB_0014c969;
          sVar8 = sVar8 + 1;
        } while (sVar8 != len);
        iVar7 = 0;
LAB_0014c969:
        if (0 < iVar7) {
          test_hsort_is_sorted_cold_1();
          uStack_48 = (ulong)bVar1;
          do {
            testrand256(auStack_70);
            secp256k1_fe_impl_set_b32_mod((secp256k1_fe *)elements,auStack_70);
            bVar3 = (((secp256k1_fe *)elements)->n[2] & ((secp256k1_fe *)elements)->n[3] &
                    ((secp256k1_fe *)elements)->n[1]) == 0xfffffffffffff;
            bVar4 = ((secp256k1_fe *)elements)->n[4] == 0xffffffffffff;
            bVar2 = 0xffffefffffc2e < ((secp256k1_fe *)elements)->n[0];
            if (bVar2 && (bVar3 && bVar4)) {
              ((secp256k1_fe *)elements)->magnitude = -1;
            }
            else {
              ((secp256k1_fe *)elements)->magnitude = 1;
              ((secp256k1_fe *)elements)->normalized = 1;
              secp256k1_fe_verify((secp256k1_fe *)elements);
            }
          } while (bVar2 && (bVar3 && bVar4));
          return;
        }
      }
      sVar6 = sVar6 + 1;
      puVar5 = puVar5 + len;
      elements = (uchar *)((long)((secp256k1_fe *)elements)->n + len);
    } while (sVar6 != n);
  }
  return;
}

Assistant:

static void test_hsort_is_sorted(unsigned char *elements, size_t n, size_t len) {
    size_t i;
    for (i = 1; i < n; i++) {
        CHECK(secp256k1_memcmp_var(&elements[(i-1) * len], &elements[i * len], len) <= 0);
    }
}